

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

void __thiscall VirtualFileSystem::VirtualFileSystem(VirtualFileSystem *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_DiskInterface).super_FileReader._vptr_FileReader =
       (_func_int **)&PTR__VirtualFileSystem_001c17a0;
  p_Var1 = &(this->files_)._M_t._M_impl.super__Rb_tree_header;
  (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->directories_made_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->directories_made_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->directories_made_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->files_read_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->files_read_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->files_read_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->files_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->files_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->files_removed_)._M_t._M_impl.super__Rb_tree_header;
  (this->files_removed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->files_removed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->files_removed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->files_removed_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->files_removed_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->files_created_)._M_t._M_impl.super__Rb_tree_header;
  (this->files_created_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->files_created_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->files_created_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->files_created_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->files_created_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->now_ = 1;
  (this->cwd_)._M_dataplus._M_p = (pointer)&(this->cwd_).field_2;
  (this->cwd_)._M_string_length = 0;
  (this->cwd_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

VirtualFileSystem() : now_(1) {}